

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall TApp_PreSpaces_Test::TestBody(TApp_PreSpaces_Test *this)

{
  bool bVar1;
  Option *this_00;
  char *in_R9;
  AssertHelper AStack_f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8;
  AssertionResult gtest_ar_;
  int x;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30," -a, --long, other",(allocator *)&local_e8);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&gtest_ar_);
  this_00 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_30,&x,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"long",(allocator *)&local_e8);
  gtest_ar_.success_ = CLI::Option::check_lname(this_00,&local_70);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_70);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&gtest_ar_,(AssertionResult *)"myapp->check_lname(\"long\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x108,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_90,"a",(allocator *)&local_e8);
  gtest_ar_.success_ = CLI::Option::check_sname(this_00,&local_90);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_90);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&gtest_ar_,(AssertionResult *)"myapp->check_sname(\"a\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x109,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_b0,"other",(allocator *)&local_e8);
  bVar1 = CLI::Option::check_name(this_00,&local_b0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  std::__cxx11::string::~string((string *)&local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&gtest_ar_,(AssertionResult *)"myapp->check_name(\"other\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x10a,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(TApp, PreSpaces) {
    int x;
    auto myapp = app.add_option(" -a, --long, other", x);

    EXPECT_TRUE(myapp->check_lname("long"));
    EXPECT_TRUE(myapp->check_sname("a"));
    EXPECT_TRUE(myapp->check_name("other"));
}